

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O3

void anon_unknown.dwarf_5f7ee::not_equals1(void)

{
  string expected;
  string msg;
  Assert local_b8 [2];
  string local_98;
  int local_74 [17];
  
  local_98._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_98._M_string_length._0_4_ = 0x72;
  local_b8[0].m_file = (char *)CONCAT44(local_b8[0].m_file._4_4_,1);
  local_74[0] = 1;
  UnitTests::Assert::NotEquals<int,int>((Assert *)&local_98,(int *)local_b8,local_74);
  local_b8[0].m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_b8[0].m_line = 0x73;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"ASSERT_NOT_EQUALS should have fired here.","");
  UnitTests::Assert::Fail(local_b8,&local_98);
}

Assistant:

TEST(assert_true1)
    {
        try
        {
            ASSERT_TRUE(1 == 2);
            FAIL("ASSERT_TRUE should have fired here.");
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg      = e.what();
            std::string expected = "error A1000: Assertion failure :  Expression evaluated to false";
            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_TRUE", __FILE__, __LINE__);
            }
        }
    }